

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::StableSign(S2Point *a,S2Point *b,S2Point *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  dVar13 = b->c_[0];
  dVar1 = b->c_[1];
  dVar2 = b->c_[2];
  dVar3 = a->c_[0];
  dVar4 = a->c_[1];
  dVar11 = dVar13 - dVar3;
  dVar17 = dVar1 - dVar4;
  dVar5 = a->c_[2];
  dVar18 = dVar2 - dVar5;
  dVar6 = c->c_[0];
  dVar7 = c->c_[1];
  dVar14 = dVar6 - dVar13;
  dVar21 = dVar7 - dVar1;
  dVar12 = dVar18 * dVar18 + dVar17 * dVar17 + dVar11 * dVar11;
  dVar8 = c->c_[2];
  dVar19 = dVar8 - dVar2;
  dVar16 = dVar19 * dVar19 + dVar21 * dVar21 + dVar14 * dVar14;
  dVar20 = dVar3 - dVar6;
  dVar15 = dVar4 - dVar7;
  dVar22 = dVar5 - dVar8;
  dVar10 = dVar22 * dVar22 + dVar15 * dVar15 + dVar20 * dVar20;
  if ((dVar12 < dVar16) || (dVar12 < dVar10)) {
    if (dVar10 <= dVar16) {
      dVar13 = -(dVar5 * (dVar11 * dVar15 - dVar17 * dVar20) +
                dVar4 * (dVar18 * dVar20 - dVar22 * dVar11) +
                dVar3 * (dVar17 * dVar22 - dVar18 * dVar15) + 0.0);
      dVar10 = dVar10 * dVar12;
    }
    else {
      dVar13 = -(dVar2 * (dVar17 * dVar14 - dVar11 * dVar21) +
                dVar1 * (dVar19 * dVar11 - dVar18 * dVar14) +
                dVar13 * (dVar18 * dVar21 - dVar17 * dVar19) + 0.0);
      dVar10 = dVar12 * dVar16;
    }
  }
  else {
    dVar13 = -(dVar8 * (dVar20 * dVar21 - dVar14 * dVar15) +
              dVar7 * (dVar22 * dVar14 - dVar19 * dVar20) +
              dVar6 * (dVar15 * dVar19 - dVar21 * dVar22) + 0.0);
    dVar10 = dVar10 * dVar16;
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  iVar9 = ((0.0 < dVar13) - 1) + (uint)(0.0 < dVar13);
  if (ABS(dVar13) <= dVar10 * 7.176703675781937e-16) {
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int StableSign(const S2Point& a, const S2Point& b, const S2Point& c) {
  Vector3_d ab = b - a;
  Vector3_d bc = c - b;
  Vector3_d ca = a - c;
  double ab2 = ab.Norm2();
  double bc2 = bc.Norm2();
  double ca2 = ca.Norm2();

  // Now compute the determinant ((A-C)x(B-C)).C, where the vertices have been
  // cyclically permuted if necessary so that AB is the longest edge.  (This
  // minimizes the magnitude of cross product.)  At the same time we also
  // compute the maximum error in the determinant.  Using a similar technique
  // to the one used for kMaxDetError, the error is at most
  //
  //   |d| <= (3 + 6/sqrt(3)) * |A-C| * |B-C| * e
  //
  // where e = 0.5 * DBL_EPSILON.  If the determinant magnitude is larger than
  // this value then we know its sign with certainty.
  const double kDetErrorMultiplier = 3.2321 * DBL_EPSILON;  // see above
  double det, max_error;
  if (ab2 >= bc2 && ab2 >= ca2) {
    // AB is the longest edge, so compute (A-C)x(B-C).C.
    det = -(ca.CrossProd(bc).DotProd(c));
    max_error = kDetErrorMultiplier * sqrt(ca2 * bc2);
  } else if (bc2 >= ca2) {
    // BC is the longest edge, so compute (B-A)x(C-A).A.
    det = -(ab.CrossProd(ca).DotProd(a));
    max_error = kDetErrorMultiplier * sqrt(ab2 * ca2);
  } else {
    // CA is the longest edge, so compute (C-B)x(A-B).B.
    det = -(bc.CrossProd(ab).DotProd(b));
    max_error = kDetErrorMultiplier * sqrt(bc2 * ab2);
  }
  return (fabs(det) <= max_error) ? 0 : (det > 0) ? 1 : -1;
}